

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int mem;
  int blocks;
  int ret;
  char **argv_local;
  int argc_local;
  
  memset(chartab,0,0x400);
  strncpy((char *)chartab,"  chartab\n",0x14);
  memset(inttab,0,0x1000);
  memset(longtab,0,0x2000);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlRelaxNGInitTypes();
  xmlCheckVersion(0x5398);
  xmlSetStructuredErrorFunc(0,structured_errors);
  xmlSetExternalEntityLoader(xmlNoNetExternalEntityLoader);
  if (argc < 2) {
    mem = testlibxml2();
  }
  else {
    iVar1 = strcmp(argv[1],"-q");
    if (iVar1 == 0) {
      quiet = 1;
      if (argc < 3) {
        mem = testlibxml2();
      }
      else {
        mem = test_module(argv[2]);
      }
    }
    else {
      mem = test_module(argv[1]);
    }
  }
  xmlCleanupParser();
  uVar2 = xmlMemBlocks();
  uVar3 = xmlMemUsed();
  if ((uVar2 != 0) || (uVar3 != 0)) {
    printf("testapi leaked %d bytes in %d blocks\n",(ulong)uVar3,(ulong)uVar2);
    mem = 1;
  }
  return (int)(mem != 0);
}

Assistant:

int main(int argc, char **argv) {
    int ret;
    int blocks, mem;

#if defined(_WIN32)
    setvbuf(stdout, NULL, _IONBF, 0);
    setvbuf(stderr, NULL, _IONBF, 0);

    printf("Skipping on Windows for now\n");
    return(0);
#endif

    memset(chartab, 0, sizeof(chartab));
    strncpy((char *) chartab, "  chartab\n", 20);
    memset(inttab, 0, sizeof(inttab));
    memset(longtab, 0, sizeof(longtab));

    xmlInitParser();
#ifdef LIBXML_CATALOG_ENABLED
    xmlInitializeCatalog();
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    xmlRelaxNGInitTypes();
#endif

    LIBXML_TEST_VERSION

    xmlSetStructuredErrorFunc(NULL, structured_errors);
    xmlSetExternalEntityLoader(xmlNoNetExternalEntityLoader);

    if (argc >= 2) {
        if (!strcmp(argv[1], "-q")) {
	    quiet = 1;
	    if (argc >= 3)
	        ret = test_module(argv[2]);
	    else
		ret = testlibxml2();
        } else {
	   ret = test_module(argv[1]);
	}
    } else
	ret = testlibxml2();

    xmlCleanupParser();
    blocks = xmlMemBlocks();
    mem = xmlMemUsed();
    if ((blocks != 0) || (mem != 0)) {
        printf("testapi leaked %d bytes in %d blocks\n", mem, blocks);
        ret = 1;
    }

    return (ret != 0);
}